

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

void __thiscall
Fl_Menu_Item::draw(Fl_Menu_Item *this,int x,int y,int w,int h,Fl_Menu_ *m,int selected)

{
  int iVar1;
  Fl_Boxtype FVar2;
  Fl_Color FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int w_00;
  int local_d8;
  Fl_Boxtype local_c0;
  Fl_Boxtype local_bc;
  Fl_Color local_b8;
  Fl_Color local_b4;
  Fl_Color local_b0;
  Fl_Color local_ac;
  Fl_Fontsize local_a8;
  Fl_Fontsize local_a4;
  Fl_Font local_a0;
  Fl_Font local_9c;
  int local_8c;
  int local_88;
  int n;
  int ty;
  int d2;
  int d1;
  int tw;
  int tx;
  int td;
  int tW;
  int W;
  int d;
  Fl_Boxtype b;
  Fl_Color r;
  Fl_Color color;
  Fl_Label l;
  Fl_Menu_ *m_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_Menu_Item *this_local;
  
  _r = this->text;
  l.value = (char *)0x0;
  l.image = (Fl_Image *)0x0;
  l.color._0_1_ = this->labeltype_;
  l._40_8_ = m;
  if ((this->labelsize_ == 0) && (this->labelfont_ == 0)) {
    if (m == (Fl_Menu_ *)0x0) {
      local_a0 = 0;
    }
    else {
      local_a0 = Fl_Menu_::textfont(m);
    }
    local_9c = local_a0;
  }
  else {
    local_9c = this->labelfont_;
  }
  l.deimage._0_4_ = local_9c;
  if (this->labelsize_ == 0) {
    if (l._40_8_ == 0) {
      local_a8 = FL_NORMAL_SIZE;
    }
    else {
      local_a8 = Fl_Menu_::textsize((Fl_Menu_ *)l._40_8_);
    }
    local_a4 = local_a8;
  }
  else {
    local_a4 = this->labelsize_;
  }
  l.deimage._4_4_ = local_a4;
  if (this->labelcolor_ == 0) {
    if (l._40_8_ == 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = Fl_Menu_::textcolor((Fl_Menu_ *)l._40_8_);
    }
    local_ac = local_b0;
  }
  else {
    local_ac = this->labelcolor_;
  }
  l.font = local_ac;
  iVar1 = active(this);
  if (iVar1 == 0) {
    l.font = fl_inactive(l.font);
  }
  if (l._40_8_ == 0) {
    local_b4 = 0x31;
  }
  else {
    local_b4 = Fl_Widget::color((Fl_Widget *)l._40_8_);
  }
  m_local._4_4_ = w;
  w_local = x;
  if (selected != 0) {
    if (l._40_8_ == 0) {
      local_b8 = 0xf;
    }
    else {
      local_b8 = Fl_Widget::selection_color((Fl_Widget *)l._40_8_);
    }
    d = local_b8;
    if ((l._40_8_ == 0) || (FVar2 = Fl_Menu_::down_box((Fl_Menu_ *)l._40_8_), FVar2 == FL_NO_BOX)) {
      local_bc = FL_FLAT_BOX;
    }
    else {
      local_bc = Fl_Menu_::down_box((Fl_Menu_ *)l._40_8_);
    }
    W = local_bc;
    FVar3 = fl_contrast(local_b8,local_b4);
    if (FVar3 == local_b8) {
      l.font = fl_contrast(this->labelcolor_,local_b8);
    }
    else if (selected == 2) {
      d = local_b4;
      if (l._40_8_ == 0) {
        local_c0 = FL_UP_BOX;
      }
      else {
        local_c0 = Fl_Widget::box((Fl_Widget *)l._40_8_);
      }
      W = local_c0;
    }
    else {
      d = 0x37;
      l.font = fl_contrast(this->labelcolor_,0x37);
    }
    if (selected == 2) {
      fl_draw_box(W,x,y,w,h,d);
      w_local = x + 3;
      m_local._4_4_ = w + -8;
    }
    else {
      fl_draw_box(W,x + 1,y + -1,w + -2,h + 2,d);
    }
  }
  if ((this->flags & 10U) != 0) {
    iVar1 = ((h - FL_NORMAL_SIZE) + 1) / 2;
    w_00 = h + iVar1 * -2;
    if ((this->flags & 8U) == 0) {
      fl_draw_box(FL_DOWN_BOX,w_local + 2,y + iVar1,w_00,w_00,7);
      iVar4 = value(this);
      if (iVar4 != 0) {
        iVar4 = Fl::is_scheme("gtk+");
        if (iVar4 == 0) {
          fl_color(this->labelcolor_);
        }
        else {
          fl_color(0xf);
        }
        iVar4 = w_local + 5;
        iVar5 = w_00 + -6;
        iVar6 = iVar5 / 3;
        local_88 = ((y + iVar1 + (w_00 + (iVar5 - iVar6)) / 2) - iVar6) + -2;
        for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
          fl_line(iVar4,local_88,iVar4 + iVar6,local_88 + iVar6);
          fl_line(iVar4 + iVar6,local_88 + iVar6,iVar4 + iVar5 + -1,
                  ((local_88 + iVar6) - (iVar5 - iVar6)) + 1);
          local_88 = local_88 + 1;
        }
      }
    }
    else {
      FVar2 = fl_define_FL_ROUND_UP_BOX();
      fl_draw_box(FVar2 + FL_FLAT_BOX,w_local + 2,y + iVar1,w_00,w_00,7);
      iVar4 = value(this);
      if (iVar4 != 0) {
        FVar2 = fl_define_FL_ROUND_UP_BOX();
        iVar4 = Fl::box_dw(FVar2 + FL_FLAT_BOX);
        iVar4 = (w_00 - iVar4) / 2;
        tx = iVar4 + 1;
        if ((w_00 - tx & 1U) != 0) {
          tx = iVar4 + 2;
        }
        iVar4 = (w_00 - tx) / 2;
        iVar5 = Fl::is_scheme("gtk+");
        if (iVar5 == 0) {
          fl_color(this->labelcolor_);
        }
        else {
          fl_color(0xf);
          fl_pie(w_local + iVar4 + 1,y + iVar1 + iVar4 + -1,tx + 2,tx + 2,0.0,360.0);
          FVar3 = fl_color_average(0xff,0xf,0.2);
          fl_color(FVar3);
          tx = tx + -1;
        }
        if (tx - 1U < 2) {
          fl_rectf(w_local + iVar4 + 2,y + iVar1 + iVar4,tx,tx);
        }
        else if (tx - 3U < 3) {
          fl_rectf(w_local + iVar4 + 3,y + iVar1 + iVar4,tx + -2,tx);
          fl_rectf(w_local + iVar4 + 2,y + iVar1 + iVar4 + 1,tx,tx + -2);
        }
        else if (tx == 6) {
          fl_rectf(w_local + iVar4 + 4,y + iVar1 + iVar4,2,6);
          fl_rectf(w_local + iVar4 + 3,y + iVar1 + iVar4 + 1,4,4);
          fl_rectf(w_local + iVar4 + 2,y + iVar1 + iVar4 + 2,6,2);
        }
        else {
          fl_pie(w_local + iVar4 + 2,y + iVar1 + iVar4,tx,tx,0.0,360.0);
        }
        iVar5 = Fl::is_scheme("gtk+");
        if (iVar5 != 0) {
          FVar3 = fl_color_average(0xff,0xf,0.5);
          fl_color(FVar3);
          fl_arc(w_local + iVar4 + 2,y + iVar1 + iVar4,tx + 1,tx + 1,60.0,180.0);
        }
      }
    }
    w_local = w_00 + 3 + w_local;
    m_local._4_4_ = m_local._4_4_ - (w_00 + 3);
  }
  if (fl_draw_shortcut == '\0') {
    fl_draw_shortcut = '\x01';
  }
  if (m_local._4_4_ < 7) {
    local_d8 = 0;
  }
  else {
    local_d8 = m_local._4_4_ + -6;
  }
  Fl_Label::draw((Fl_Label *)&r,w_local + 3,y,local_d8,h,4);
  fl_draw_shortcut = '\0';
  return;
}

Assistant:

void Fl_Menu_Item::draw(int x, int y, int w, int h, const Fl_Menu_* m,
			int selected) const {
  Fl_Label l;
  l.value   = text;
  l.image   = 0;
  l.deimage = 0;
  l.type    = labeltype_;
  l.font    = labelsize_ || labelfont_ ? labelfont_ : (m ? m->textfont() : FL_HELVETICA);
  l.size    = labelsize_ ? labelsize_ : m ? m->textsize() : FL_NORMAL_SIZE;
  l.color   = labelcolor_ ? labelcolor_ : m ? m->textcolor() : int(FL_FOREGROUND_COLOR);
  if (!active()) l.color = fl_inactive((Fl_Color)l.color);
  Fl_Color color = m ? m->color() : FL_GRAY;
  if (selected) {
    Fl_Color r = m ? m->selection_color() : FL_SELECTION_COLOR;
    Fl_Boxtype b = m && m->down_box() ? m->down_box() : FL_FLAT_BOX;
    if (fl_contrast(r,color)!=r) { // back compatibility boxtypes
      if (selected == 2) { // menu title
	r = color;
	b = m ? m->box() : FL_UP_BOX;
      } else {
	r = (Fl_Color)(FL_COLOR_CUBE-1); // white
	l.color = fl_contrast((Fl_Color)labelcolor_, r);
      }
    } else {
      l.color = fl_contrast((Fl_Color)labelcolor_, r);
    }
    if (selected == 2) { // menu title
      fl_draw_box(b, x, y, w, h, r);
      x += 3;
      w -= 8;
    } else {
      fl_draw_box(b, x+1, y-(LEADING-2)/2, w-2, h+(LEADING-2), r);
    }
  }

  if (flags & (FL_MENU_TOGGLE|FL_MENU_RADIO)) {
    int d = (h - FL_NORMAL_SIZE + 1) / 2;
    int W = h - 2 * d;

    if (flags & FL_MENU_RADIO) {
      fl_draw_box(FL_ROUND_DOWN_BOX, x+2, y+d, W, W, FL_BACKGROUND2_COLOR);
      if (value()) {
	int tW = (W - Fl::box_dw(FL_ROUND_DOWN_BOX)) / 2 + 1;
	if ((W - tW) & 1) tW++;	// Make sure difference is even to center
	int td = (W - tW) / 2;
        if (Fl::is_scheme("gtk+")) {
	  fl_color(FL_SELECTION_COLOR);
	  tW --;
	  fl_pie(x + td + 1, y + d + td - 1, tW + 3, tW + 3, 0.0, 360.0);
	  fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.2f));
	} else fl_color(labelcolor_);

	switch (tW) {
	  // Larger circles draw fine...
	  default :
            fl_pie(x + td + 2, y + d + td, tW, tW, 0.0, 360.0);
	    break;

          // Small circles don't draw well on many systems...
	  case 6 :
	    fl_rectf(x + td + 4, y + d + td, tW - 4, tW);
	    fl_rectf(x + td + 3, y + d + td + 1, tW - 2, tW - 2);
	    fl_rectf(x + td + 2, y + d + td + 2, tW, tW - 4);
	    break;

	  case 5 :
	  case 4 :
	  case 3 :
	    fl_rectf(x + td + 3, y + d + td, tW - 2, tW);
	    fl_rectf(x + td + 2, y + d + td + 1, tW, tW - 2);
	    break;

	  case 2 :
	  case 1 :
	    fl_rectf(x + td + 2, y + d + td, tW, tW);
	    break;
	}

	if (Fl::is_scheme("gtk+")) {
	  fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.5));
	  fl_arc(x + td + 2, y + d + td, tW + 1, tW + 1, 60.0, 180.0);
	}
      }
    } else {
      fl_draw_box(FL_DOWN_BOX, x+2, y+d, W, W, FL_BACKGROUND2_COLOR);
      if (value()) {
	if (Fl::is_scheme("gtk+")) {
	  fl_color(FL_SELECTION_COLOR);
	} else {
	  fl_color(labelcolor_);
	}
	int tx = x + 5;
	int tw = W - 6;
	int d1 = tw/3;
	int d2 = tw-d1;
	int ty = y + d + (W+d2)/2-d1-2;
	for (int n = 0; n < 3; n++, ty++) {
	  fl_line(tx, ty, tx+d1, ty+d1);
	  fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	}
      }
    }
    x += W + 3;
    w -= W + 3;
  }

  if (!fl_draw_shortcut) fl_draw_shortcut = 1;
  l.draw(x+3, y, w>6 ? w-6 : 0, h, FL_ALIGN_LEFT);
  fl_draw_shortcut = 0;
}